

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int SafeDecodeCommandBlockSwitch(BrotliDecoderStateInternal *s,int position)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  HuffmanCode *pHVar4;
  ulong uVar5;
  byte *pbVar6;
  byte *pbVar7;
  int iVar8;
  ulong uVar9;
  uint32_t uVar10;
  HuffmanCode *pHVar11;
  uint32_t uVar12;
  size_t sVar13;
  uint uVar14;
  BrotliBitReader *br;
  uint local_4c;
  BrotliBitReader *local_48;
  uint local_3c;
  size_t local_38;
  
  uVar2 = s->num_block_types[1];
  if (uVar2 < 2) {
LAB_00105d7d:
    iVar8 = 0;
  }
  else {
    pHVar11 = s->block_type_trees;
    pHVar4 = s->block_len_trees;
    br = &s->br;
    uVar5 = (s->br).val_;
    uVar3 = (s->br).bit_pos_;
    pbVar6 = (s->br).next_in;
    local_38 = (s->br).avail_in;
    uVar14 = uVar3 - 0x32;
    uVar9 = uVar5;
    uVar10 = uVar3;
    pbVar7 = pbVar6;
    sVar13 = local_38;
    while (uVar14 < 0xf) {
      sVar13 = sVar13 - 1;
      if (sVar13 == 0xffffffffffffffff) {
        local_48 = br;
        iVar8 = SafeDecodeSymbol(pHVar11 + 0x278,br,&local_4c);
        br = local_48;
        if (iVar8 != 0) goto LAB_00105b82;
        goto LAB_00105d7d;
      }
      (s->br).val_ = uVar9 >> 8;
      uVar9 = uVar9 >> 8 | (ulong)*pbVar7 << 0x38;
      (s->br).val_ = uVar9;
      (s->br).bit_pos_ = uVar10 - 8;
      (s->br).avail_in = sVar13;
      (s->br).next_in = pbVar7 + 1;
      uVar14 = uVar10 - 0x3a;
      uVar10 = uVar10 - 8;
      pbVar7 = pbVar7 + 1;
    }
    uVar9 = uVar9 >> ((byte)uVar10 & 0x3f);
    pHVar11 = pHVar11 + 0x278 + (uVar9 & 0xff);
    uVar14 = (uint)pHVar11->bits;
    if (8 < uVar14) {
      uVar10 = uVar10 + 8;
      pHVar11 = pHVar11 + (((uint)(uVar9 >> 8) & 0xffffff & kBitMask[pHVar11->bits - 8] & 0x7f) +
                          (uint)pHVar11->value);
      uVar14 = (uint)pHVar11->bits;
    }
    (s->br).bit_pos_ = uVar14 + uVar10;
    local_4c = (uint)pHVar11->value;
LAB_00105b82:
    if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
      uVar10 = (s->br).bit_pos_;
      if (uVar10 - 0x32 < 0xf) {
        sVar13 = (s->br).avail_in;
        uVar12 = uVar10;
        do {
          sVar13 = sVar13 - 1;
          if (sVar13 == 0xffffffffffffffff) {
            local_48 = (BrotliBitReader *)CONCAT44(local_48._4_4_,position);
            iVar8 = SafeDecodeSymbol(pHVar4 + 0x18c,br,&local_3c);
            if (iVar8 == 0) goto LAB_00105d5a;
            position = (uint32_t)local_48;
            goto LAB_00105c8b;
          }
          uVar9 = (s->br).val_;
          pbVar7 = (s->br).next_in;
          (s->br).val_ = uVar9 >> 8;
          uVar9 = (ulong)*pbVar7 << 0x38 | uVar9 >> 8;
          (s->br).val_ = uVar9;
          uVar10 = uVar12 - 8;
          (s->br).bit_pos_ = uVar10;
          (s->br).avail_in = sVar13;
          (s->br).next_in = pbVar7 + 1;
          uVar14 = uVar12 - 0x3a;
          uVar12 = uVar10;
        } while (uVar14 < 0xf);
      }
      else {
        uVar9 = br->val_;
      }
      uVar9 = uVar9 >> ((byte)uVar10 & 0x3f);
      pHVar11 = pHVar4 + 0x18c + (uVar9 & 0xff);
      uVar14 = (uint)pHVar11->bits;
      if (8 < uVar14) {
        uVar10 = uVar10 + 8;
        pHVar11 = pHVar11 + (((uint)(uVar9 >> 8) & 0xffffff & kBitMask[pHVar11->bits - 8] & 0x7f) +
                            (uint)pHVar11->value);
        uVar14 = (uint)pHVar11->bits;
      }
      (s->br).bit_pos_ = uVar14 + uVar10;
      local_3c = (uint)pHVar11->value;
    }
    else {
      local_3c = s->block_length_index;
    }
LAB_00105c8b:
    bVar1 = kBlockLengthPrefixCode[local_3c].nbits;
    uVar10 = (s->br).bit_pos_;
    uVar14 = 0x40 - uVar10;
    if (uVar14 < bVar1) {
      sVar13 = (s->br).avail_in;
      do {
        sVar13 = sVar13 - 1;
        if (sVar13 == 0xffffffffffffffff) {
          s->block_length_index = local_3c;
LAB_00105d5a:
          s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
          (s->br).val_ = uVar5;
          (s->br).bit_pos_ = uVar3;
          (s->br).next_in = pbVar6;
          (s->br).avail_in = local_38;
          goto LAB_00105d7d;
        }
        uVar9 = (s->br).val_;
        pbVar7 = (s->br).next_in;
        (s->br).val_ = uVar9 >> 8;
        uVar9 = (ulong)*pbVar7 << 0x38 | uVar9 >> 8;
        (s->br).val_ = uVar9;
        uVar10 = uVar10 - 8;
        (s->br).bit_pos_ = uVar10;
        (s->br).avail_in = sVar13;
        (s->br).next_in = pbVar7 + 1;
        uVar14 = uVar14 + 8;
      } while (uVar14 < bVar1);
    }
    else {
      uVar9 = br->val_;
    }
    uVar14 = kBitMask[(uint)bVar1];
    (s->br).bit_pos_ = uVar10 + bVar1;
    s->block_length[1] =
         (uint)kBlockLengthPrefixCode[local_3c].offset +
         ((uint)(uVar9 >> ((byte)uVar10 & 0x3f)) & uVar14);
    s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
    if (local_4c == 0) {
      local_4c = s->block_type_rb[2];
    }
    else if (local_4c == 1) {
      local_4c = s->block_type_rb[3] + 1;
    }
    else {
      local_4c = local_4c - 2;
    }
    uVar14 = 0;
    if (uVar2 <= local_4c) {
      uVar14 = uVar2;
    }
    s->block_type_rb[2] = s->block_type_rb[3];
    s->block_type_rb[3] = local_4c - uVar14;
    s->htree_command = (s->insert_copy_hgroup).htrees[local_4c - uVar14];
    iVar8 = 1;
    if ((s->field_0x338 & 0x40) != 0) {
      if (s->saved_position_lengths_begin == 0) {
        sVar13 = (s->insert_copy_length_block_splits).num_blocks;
      }
      else {
        sVar13 = (s->insert_copy_length_block_splits).num_blocks;
        (s->insert_copy_length_block_splits).positions_end[sVar13] = position;
        sVar13 = sVar13 + 1;
        (s->insert_copy_length_block_splits).num_blocks = sVar13;
      }
      (s->insert_copy_length_block_splits).positions_begin[sVar13] = position;
      (s->insert_copy_length_block_splits).types[sVar13] =
           (char)(int)(s->insert_copy_length_block_splits).num_types_prev_metablocks +
           (char)s->block_type_rb[3];
      uVar5 = (s->insert_copy_length_block_splits).num_types;
      uVar9 = (ulong)(s->insert_copy_length_block_splits).types
                     [(s->insert_copy_length_block_splits).num_blocks] + 1;
      if (uVar9 < uVar5) {
        uVar9 = uVar5;
      }
      (s->insert_copy_length_block_splits).num_types = uVar9;
    }
  }
  return iVar8;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(
    int safe, BrotliDecoderState* s, int tree_type) {
  uint32_t max_block_type = s->num_block_types[tree_type];
  const HuffmanCode* type_tree = &s->block_type_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
  const HuffmanCode* len_tree = &s->block_len_trees[
      tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
  BrotliBitReader* br = &s->br;
  uint32_t* ringbuffer = &s->block_type_rb[tree_type * 2];
  uint32_t block_type;
  if (max_block_type <= 1) {
    return BROTLI_FALSE;
  }

  /* Read 0..15 + 3..39 bits. */
  if (!safe) {
    block_type = ReadSymbol(type_tree, br);
    s->block_length[tree_type] = ReadBlockLength(len_tree, br);
  } else {
    BrotliBitReaderState memento;
    BrotliBitReaderSaveState(br, &memento);
    if (!SafeReadSymbol(type_tree, br, &block_type)) return BROTLI_FALSE;
    if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      BrotliBitReaderRestoreState(br, &memento);
      return BROTLI_FALSE;
    }
  }

  if (block_type == 1) {
    block_type = ringbuffer[1] + 1;
  } else if (block_type == 0) {
    block_type = ringbuffer[0];
  } else {
    block_type -= 2;
  }
  if (block_type >= max_block_type) {
    block_type -= max_block_type;
  }
  ringbuffer[0] = ringbuffer[1];
  ringbuffer[1] = block_type;
  return BROTLI_TRUE;
}